

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

void skiwi::anon_unknown_26::compile_prim_call_not_inlined
               (registered_functions *fns,environment_map *env,repl_data *rd,compile_data *data,
               asmcode *code,PrimitiveCall *prim,primitive_map *pm,compiler_options *options)

{
  int iVar1;
  skiwi *psVar2;
  undefined8 uVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> *this;
  size_type sVar8;
  pointer prVar9;
  const_reference pvVar10;
  reference expr_00;
  size_type sVar11;
  const_reference pvVar12;
  element_type *this_00;
  ulong uVar13;
  pointer ppVar14;
  reference puVar15;
  reference poVar16;
  uint64_t extraout_RDX;
  uint64_t extraout_RDX_00;
  uint64_t extraout_RDX_01;
  uint64_t extraout_RDX_02;
  uint64_t extraout_RDX_03;
  uint64_t lab;
  uint64_t extraout_RDX_04;
  uint64_t extraout_RDX_05;
  uint64_t extraout_RDX_06;
  uint64_t extraout_RDX_07;
  uint64_t extraout_RDX_08;
  uint64_t lab_00;
  uint64_t lab_01;
  uint64_t lab_02;
  undefined1 local_4a0 [16];
  reverse_iterator it_1;
  string local_488;
  uint local_464;
  undefined1 local_460 [4];
  uint32_t local_id_3;
  reverse_iterator it;
  operation local_448;
  operand local_444;
  operand local_440;
  operation local_43c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  operation local_414;
  string local_410;
  _Self local_3f0;
  _Self local_3e8;
  const_iterator pm_it;
  operand local_3d4 [2];
  operation local_3cc;
  operand local_3c8 [2];
  operation local_3c0;
  operand local_3bc [2];
  operation local_3b4 [2];
  operand local_3ac;
  operation local_3a8;
  operand local_3a4 [2];
  operation local_39c;
  operand local_398 [2];
  operation local_390;
  allocator<char> local_389;
  string local_388;
  _Self local_368;
  allocator<char> local_359;
  key_type local_358;
  _Self local_338;
  const_iterator pm_it_1;
  operation local_328 [2];
  operand local_320 [2];
  operation local_318 [3];
  operand local_30c [2];
  operation local_304;
  undefined1 local_300 [8];
  string continue_label2;
  string garbage_error;
  operand local_2b8;
  operation local_2b4 [2];
  operand local_2ac [2];
  operation local_2a4 [2];
  operand local_29c [2];
  operation local_294 [2];
  operand local_28c [2];
  operation local_284 [2];
  operand local_27c [2];
  operation local_274 [2];
  operand local_26c [2];
  operation local_264 [2];
  operand local_25c [2];
  operation local_254 [3];
  operand local_248 [2];
  operation local_240 [2];
  operand local_238 [2];
  operation local_230 [2];
  operand local_228 [2];
  operation local_220 [2];
  undefined1 local_218 [8];
  string repeat_clean_locals;
  operand local_1f0;
  operation local_1ec;
  operand local_1e8 [2];
  operation local_1e0 [2];
  operand local_1d8 [2];
  operation local_1d0 [2];
  undefined1 local_1c8 [8];
  string continue_label;
  value_type *reg_2;
  string local_198;
  uint local_178;
  int local_174;
  uint32_t local_id_2;
  int i_5;
  const_reference local_168;
  value_type *reg_1;
  string local_158;
  uint local_138;
  int local_134;
  uint32_t local_id_1;
  int i_3;
  int i_4;
  int i_2;
  environment_entry e;
  Variable *var;
  value_type *arg;
  int i_1;
  variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  *expr;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  *__range2;
  bool expressions_can_be_targetted;
  value_type *reg;
  allocator<char> local_a9;
  string local_a8;
  uint local_88;
  int local_84;
  uint32_t local_id;
  int i;
  vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
  registers_that_were_not_free;
  vector<unsigned_int,_std::allocator<unsigned_int>_> locals_that_were_not_free;
  int nr_prim_args;
  vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> *arg_reg;
  PrimitiveCall *prim_local;
  asmcode *code_local;
  compile_data *data_local;
  repl_data *rd_local;
  environment_map *env_local;
  registered_functions *fns_local;
  
  bVar5 = is_inlined_primitive(&prim->primitive_name);
  if (((bVar5 ^ 0xffU) & 1) != 0) {
    this = get_argument_registers();
    sVar8 = std::
            vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
            ::size(&prim->arguments);
    iVar7 = (int)sVar8;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &registers_that_were_not_free.
                super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::vector
              ((vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> *)
               &local_id);
    for (local_84 = 0; iVar1 = local_84, local_84 < iVar7; local_84 = local_84 + 1) {
      sVar8 = std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
              ::size(this);
      iVar4 = local_84;
      if (iVar1 < (int)sVar8) {
        pvVar10 = std::
                  vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                  ::operator[](this,(long)local_84);
        prVar9 = std::unique_ptr<skiwi::reg_alloc,_std::default_delete<skiwi::reg_alloc>_>::
                 operator->(&data->ra);
        bVar5 = reg_alloc::is_free_register(prVar9,*pvVar10);
        if (!bVar5) {
          std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
          push_back((vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                     *)&local_id,pvVar10);
          push(code,*pvVar10);
        }
      }
      else {
        sVar8 = std::
                vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
                size(this);
        local_88 = iVar4 - (int)sVar8;
        if (data->local_stack_size <= local_88) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_a9);
          throw_error(too_many_locals,&local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
          std::allocator<char>::~allocator(&local_a9);
        }
        prVar9 = std::unique_ptr<skiwi::reg_alloc,_std::default_delete<skiwi::reg_alloc>_>::
                 operator->(&data->ra);
        bVar5 = reg_alloc::is_free_local(prVar9,local_88);
        if (!bVar5) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &registers_that_were_not_free.
                      super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_88);
          load_local(code,(ulong)local_88);
          push(code,RAX);
        }
      }
    }
    __range2._7_1_ = (bool)(options->fast_expression_targetting & 1);
    __end2 = std::
             vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
             ::begin(&prim->arguments);
    expr = (variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
            *)std::
              vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
              ::end(&prim->arguments);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>
                                       *)&expr), bVar5) {
      expr_00 = __gnu_cxx::
                __normal_iterator<const_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>
                ::operator*(&__end2);
      bVar5 = expression_can_be_targetted(expr_00);
      __range2._7_1_ = (__range2._7_1_ & bVar5) != 0;
      __gnu_cxx::
      __normal_iterator<const_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>
      ::operator++(&__end2);
    }
    sVar8 = std::
            vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
            ::size(&prim->arguments);
    sVar11 = std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
             ::size(this);
    bVar5 = (__range2._7_1_ & sVar8 <= sVar11) != 0;
    lab = extraout_RDX;
    if ((bVar5) &&
       (bVar6 = std::
                vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                ::empty(&prim->arguments), lab = extraout_RDX_00, !bVar6)) {
      for (arg._4_4_ = 0; arg._4_4_ < iVar7; arg._4_4_ = arg._4_4_ + 1) {
        pvVar12 = std::
                  vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                  ::operator[](&prim->arguments,(long)arg._4_4_);
        bVar6 = std::
                holds_alternative<skiwi::Variable,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                          (pvVar12);
        lab = extraout_RDX_01;
        if (bVar6) {
          e.live_range.last =
               (uint64_t)
               std::
               get<skiwi::Variable,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                         (pvVar12);
          environment_entry::environment_entry((environment_entry *)&i_4);
          this_00 = std::
                    __shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)env);
          bVar6 = environment<skiwi::environment_entry>::find
                            (this_00,(environment_entry *)&i_4,(string *)(e.live_range.last + 8));
          uVar3 = e._0_8_;
          lab = extraout_RDX_02;
          if (((bVar6) && (i_4 == 0)) &&
             (pvVar10 = std::
                        vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                        ::operator[](this,(long)arg._4_4_), lab = extraout_RDX_03,
             (ulong)uVar3 < (ulong)*pvVar10)) {
            bVar5 = false;
          }
        }
      }
    }
    if (bVar5) {
      for (i_3 = 0; uVar13 = (ulong)i_3,
          sVar8 = std::
                  vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                  ::size(&prim->arguments), lab = extraout_RDX_04, uVar13 < sVar8; i_3 = i_3 + 1) {
        pvVar12 = std::
                  vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                  ::operator[](&prim->arguments,(long)i_3);
        pvVar10 = std::
                  vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                  ::operator[](this,(long)i_3);
        compile_expression(fns,env,rd,data,code,pvVar12,pm,options,*pvVar10,false);
      }
    }
    else {
      if (0 < iVar7) {
        for (local_id_1 = 0; (int)local_id_1 < iVar7 + -1; local_id_1 = local_id_1 + 1) {
          pvVar12 = std::
                    vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                    ::operator[](&prim->arguments,(long)(int)local_id_1);
          compile_expression(fns,env,rd,data,code,pvVar12,pm,options,RAX,true);
          push(code,RAX);
        }
        pvVar12 = std::
                  vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                  ::back(&prim->arguments);
        compile_expression(fns,env,rd,data,code,pvVar12,pm,options,RAX,true);
        sVar8 = std::
                vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                ::size(&prim->arguments);
        local_134 = (int)sVar8 + -1;
        uVar13 = (ulong)local_134;
        sVar8 = std::
                vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
                size(this);
        iVar1 = local_134;
        if (uVar13 < sVar8) {
          local_168 = std::
                      vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                      ::operator[](this,(long)local_134);
          i_5 = 0x40;
          local_id_2 = 9;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand_const&,assembler::asmcode::operand>
                    (code,(operation *)&i_5,local_168,&local_id_2);
          lab = extraout_RDX_06;
        }
        else {
          sVar8 = std::
                  vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                  ::size(this);
          local_138 = iVar1 - (int)sVar8;
          if (data->local_stack_size <= local_138) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_158,"",(allocator<char> *)((long)&reg_1 + 7));
            throw_error(too_many_locals,&local_158);
            std::__cxx11::string::~string((string *)&local_158);
            std::allocator<char>::~allocator((allocator<char> *)((long)&reg_1 + 7));
          }
          save_to_local(code,(ulong)local_138);
          lab = extraout_RDX_05;
        }
      }
      for (local_174 = iVar7 + -2; -1 < local_174; local_174 = local_174 + -1) {
        uVar13 = (ulong)local_174;
        sVar8 = std::
                vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
                size(this);
        iVar7 = local_174;
        if (uVar13 < sVar8) {
          continue_label.field_2._8_8_ =
               std::
               vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
               operator[](this,(long)local_174);
          pop(code,*(operand *)continue_label.field_2._8_8_);
          lab = extraout_RDX_08;
        }
        else {
          sVar8 = std::
                  vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                  ::size(this);
          local_178 = iVar7 - (int)sVar8;
          if (data->local_stack_size <= local_178) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_198,"",(allocator<char> *)((long)&reg_2 + 7));
            throw_error(too_many_locals,&local_198);
            std::__cxx11::string::~string((string *)&local_198);
            std::allocator<char>::~allocator((allocator<char> *)((long)&reg_2 + 7));
          }
          pop(code,RAX);
          save_to_local(code,(ulong)local_178);
          lab = extraout_RDX_07;
        }
      }
    }
    psVar2 = label;
    label = label + 1;
    label_to_string_abi_cxx11_((string *)local_1c8,psVar2,lab);
    bVar5 = std::operator==(&prim->primitive_name,"halt");
    if (bVar5) {
      if ((options->garbage_collection & 1U) != 0) {
        local_1d0[1] = 9;
        assembler::asmcode::add<assembler::asmcode::operation,char_const(&)[24]>
                  (code,local_1d0 + 1,(char (*) [24])"clean all locals for gc");
        local_1d0[0] = MOV;
        local_1d8[1] = 0x18;
        local_1d8[0] = MEM_R10;
        local_1e0[1] = 0x88;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,local_1d0,local_1d8 + 1,local_1d8,(int *)(local_1e0 + 1));
        local_1e0[0] = MOV;
        local_1e8[1] = 0x14;
        local_1e8[0] = R15;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
                  (code,local_1e0,local_1e8 + 1,local_1e8);
        local_1ec = ADD;
        local_1f0 = R11;
        repeat_clean_locals.field_2._12_4_ = 0x39;
        repeat_clean_locals.field_2._8_4_ = data->local_stack_size << 3;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_int>
                  (code,&local_1ec,&stack0xfffffffffffffe10,
                   (operand *)(repeat_clean_locals.field_2._M_local_buf + 0xc),
                   (uint *)(repeat_clean_locals.field_2._M_local_buf + 8));
        psVar2 = label;
        label = label + 1;
        label_to_string_abi_cxx11_((string *)local_218,psVar2,lab_00);
        local_220[1] = 0x3e;
        assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
                  (code,local_220 + 1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218);
        local_220[0] = MOV;
        local_228[1] = 0x28;
        local_228[0] = NUMBER;
        local_230[1] = 0x3f;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,local_220,local_228 + 1,local_228,(int *)(local_230 + 1));
        local_230[0] = ADD;
        local_238[1] = 0x18;
        local_238[0] = NUMBER;
        local_240[1] = 8;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,local_230,local_238 + 1,local_238,(int *)(local_240 + 1));
        local_240[0] = CMP;
        local_248[1] = 0x18;
        local_248[0] = R11;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
                  (code,local_240,local_248 + 1,local_248);
        local_254[2] = 0x39;
        assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
                  (code,local_254 + 2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218);
        local_254[1] = 9;
        assembler::asmcode::add<assembler::asmcode::operation,char_const(&)[27]>
                  (code,local_254 + 1,(char (*) [27])"clean all registers for gc");
        local_254[0] = MOV;
        local_25c[1] = 0xc;
        local_25c[0] = NUMBER;
        local_264[1] = 0x3f;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,local_254,local_25c + 1,local_25c,(int *)(local_264 + 1));
        local_264[0] = MOV;
        local_26c[1] = 0xd;
        local_26c[0] = NUMBER;
        local_274[1] = 0x3f;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,local_264,local_26c + 1,local_26c,(int *)(local_274 + 1));
        local_274[0] = MOV;
        local_27c[1] = 0xe;
        local_27c[0] = NUMBER;
        local_284[1] = 0x3f;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,local_274,local_27c + 1,local_27c,(int *)(local_284 + 1));
        local_284[0] = MOV;
        local_28c[1] = 0x11;
        local_28c[0] = NUMBER;
        local_294[1] = 0x3f;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,local_284,local_28c + 1,local_28c,(int *)(local_294 + 1));
        local_294[0] = MOV;
        local_29c[1] = 0x12;
        local_29c[0] = NUMBER;
        local_2a4[1] = 0x3f;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,local_294,local_29c + 1,local_29c,(int *)(local_2a4 + 1));
        local_2a4[0] = MOV;
        local_2ac[1] = 0x15;
        local_2ac[0] = NUMBER;
        local_2b4[1] = 0x3f;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,local_2a4,local_2ac + 1,local_2ac,(int *)(local_2b4 + 1));
        local_2b4[0] = MOV;
        local_2b8 = R14;
        garbage_error.field_2._12_4_ = 0x39;
        garbage_error.field_2._8_4_ = 0x3f;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,local_2b4,&stack0xfffffffffffffd48,
                   (operand *)(garbage_error.field_2._M_local_buf + 0xc),
                   (int *)(garbage_error.field_2._M_local_buf + 8));
        psVar2 = label;
        label = label + 1;
        label_to_string_abi_cxx11_((string *)((long)&continue_label2.field_2 + 8),psVar2,lab_01);
        psVar2 = label;
        label = label + 1;
        label_to_string_abi_cxx11_((string *)local_300,psVar2,lab_02);
        local_304 = CMP;
        local_30c[1] = 0x10;
        local_30c[0] = MEM_R10;
        local_318[2] = 0x50;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,&local_304,local_30c + 1,local_30c,(int *)(local_318 + 2));
        local_318[1] = 0x3a;
        assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
                  (code,local_318 + 1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300);
        local_318[0] = CMP;
        local_320[1] = 0x10;
        local_320[0] = MEM_R10;
        local_328[1] = 0x60;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,local_318,local_320 + 1,local_320,(int *)(local_328 + 1));
        local_328[0] = JGES;
        assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
                  (code,local_328,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&continue_label2.field_2 + 8));
        pm_it_1._M_node._4_4_ = 9;
        assembler::asmcode::add<assembler::asmcode::operation,char_const(&)[24]>
                  (code,(operation *)((long)&pm_it_1._M_node + 4),
                   (char (*) [24])"jump to reclaim-garbage");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_358,"reclaim-garbage",&local_359);
        local_338._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::primitive_entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::primitive_entry>_>_>
             ::find(pm,&local_358);
        std::__cxx11::string::~string((string *)&local_358);
        std::allocator<char>::~allocator(&local_359);
        local_368._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::primitive_entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::primitive_entry>_>_>
             ::end(pm);
        bVar5 = std::operator==(&local_338,&local_368);
        if (bVar5) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_388,"reclaim-garbage",&local_389);
          throw_error(primitive_unknown,&local_388);
          std::__cxx11::string::~string((string *)&local_388);
          std::allocator<char>::~allocator(&local_389);
        }
        local_390 = MOV;
        local_398[1] = 9;
        local_398[0] = NUMBER;
        ppVar14 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::primitive_entry>_>
                  ::operator->(&local_338);
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long_const&>
                  (code,&local_390,local_398 + 1,local_398,&(ppVar14->second).address);
        local_39c = MOV;
        local_3a4[1] = 10;
        local_3a4[0] = LABELADDRESS;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,std::__cxx11::string&>
                  (code,&local_39c,local_3a4 + 1,local_3a4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300);
        local_3a8 = JMP;
        local_3ac = RAX;
        assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
                  (code,&local_3a8,&local_3ac);
        error_label(code,(string *)((long)&continue_label2.field_2 + 8),re_heap_full);
        local_3b4[1] = 0x3e;
        assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
                  (code,local_3b4 + 1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300);
        std::__cxx11::string::~string((string *)local_300);
        std::__cxx11::string::~string((string *)(continue_label2.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_218);
      }
      local_3b4[0] = MOV;
      local_3bc[1] = 10;
      local_3bc[0] = LABELADDRESS;
      assembler::asmcode::
      add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,std::__cxx11::string&>
                (code,local_3b4,local_3bc + 1,local_3bc,&data->halt_label);
    }
    else {
      local_3c0 = MOV;
      local_3c8[1] = 10;
      local_3c8[0] = LABELADDRESS;
      assembler::asmcode::
      add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,std::__cxx11::string&>
                (code,&local_3c0,local_3c8 + 1,local_3c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
    }
    local_3cc = MOV;
    local_3d4[1] = 0x14;
    local_3d4[0] = NUMBER;
    pm_it._M_node =
         (_Base_ptr)
         std::
         vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
         ::size(&prim->arguments);
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
              (code,&local_3cc,local_3d4 + 1,local_3d4,(unsigned_long *)&pm_it);
    local_3e8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::primitive_entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::primitive_entry>_>_>
         ::find(pm,&prim->primitive_name);
    local_3f0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::primitive_entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::primitive_entry>_>_>
         ::end(pm);
    bVar5 = std::operator==(&local_3e8,&local_3f0);
    if (bVar5) {
      iVar7 = prim->line_nr;
      iVar1 = prim->column_nr;
      std::__cxx11::string::string((string *)&local_410,(string *)&prim->primitive_name);
      throw_error(iVar7,iVar1,&prim->filename,primitive_unknown,&local_410);
      std::__cxx11::string::~string((string *)&local_410);
    }
    local_414 = COMMENT;
    ppVar14 = std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::primitive_entry>_>
              ::operator->(&local_3e8);
    std::operator+(&local_438,"jump to ",&ppVar14->first);
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string>
              (code,&local_414,&local_438);
    std::__cxx11::string::~string((string *)&local_438);
    local_43c = MOV;
    local_440 = RAX;
    local_444 = NUMBER;
    ppVar14 = std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::primitive_entry>_>
              ::operator->(&local_3e8);
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long_const&>
              (code,&local_43c,&local_440,&stack0xfffffffffffffbbc,&(ppVar14->second).address);
    local_448 = JMP;
    it.current._M_current._4_4_ = 9;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,&stack0xfffffffffffffbb8,(operand *)((long)&it.current._M_current + 4));
    it.current._M_current._0_4_ = 0x3e;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&it,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::rbegin
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xfffffffffffffba8);
    while( true ) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::rend
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_460);
      bVar5 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)&stack0xfffffffffffffba8,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)local_460);
      if (!bVar5) break;
      puVar15 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)&stack0xfffffffffffffba8);
      local_464 = *puVar15;
      if (data->local_stack_size <= local_464) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_488,"",(allocator<char> *)((long)&it_1.current._M_current + 7));
        throw_error(too_many_locals,&local_488);
        std::__cxx11::string::~string((string *)&local_488);
        std::allocator<char>::~allocator((allocator<char> *)((long)&it_1.current._M_current + 7));
      }
      pop(code,R11);
      save_to_local(code,(ulong)local_464,R11,R15);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)&stack0xfffffffffffffba8);
    }
    std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::rbegin
              ((vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> *)
               (local_4a0 + 8));
    while( true ) {
      std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::rend
                ((vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                  *)local_4a0);
      bVar5 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<assembler::asmcode::operand_*,_std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>_>_>
                               *)(local_4a0 + 8),
                              (reverse_iterator<__gnu_cxx::__normal_iterator<assembler::asmcode::operand_*,_std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>_>_>
                               *)local_4a0);
      if (!bVar5) break;
      poVar16 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<assembler::asmcode::operand_*,_std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>_>_>
                ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<assembler::asmcode::operand_*,_std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>_>_>
                             *)(local_4a0 + 8));
      pop(code,*poVar16);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<assembler::asmcode::operand_*,_std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<assembler::asmcode::operand_*,_std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>_>_>
                    *)(local_4a0 + 8));
    }
    std::__cxx11::string::~string((string *)local_1c8);
    std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::~vector
              ((vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> *)
               &local_id);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &registers_that_were_not_free.
                super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return;
  }
  __assert_fail("!is_inlined_primitive(prim.primitive_name)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/compiler.cpp"
                ,0x410,
                "void skiwi::(anonymous namespace)::compile_prim_call_not_inlined(registered_functions &, environment_map &, repl_data &, compile_data &, asmcode &, const PrimitiveCall &, const primitive_map &, const compiler_options &)"
               );
}

Assistant:

void compile_prim_call_not_inlined(registered_functions& fns, environment_map& env, repl_data& rd, compile_data& data, asmcode& code, const PrimitiveCall& prim, const primitive_map& pm, const compiler_options& options)
    {
    assert(!is_inlined_primitive(prim.primitive_name));

    const auto& arg_reg = get_argument_registers();
    int nr_prim_args = (int)prim.arguments.size();
    /*
    First we check whether the registers and locals for arguments are free.
    If they are not free we first push them onto the stack, and pop them at the end.
    */
    std::vector<uint32_t> locals_that_were_not_free;
    std::vector<asmcode::operand> registers_that_were_not_free;
    for (int i = 0; i < nr_prim_args; ++i)
      {
      if (i >= (int)arg_reg.size())
        {
        uint32_t local_id = (uint32_t)(i - (int)arg_reg.size());
        if (local_id >= data.local_stack_size)
          throw_error(too_many_locals);
        if (!data.ra->is_free_local(local_id))
          {
          locals_that_were_not_free.push_back(local_id);
          load_local(code, local_id);
          //code.add(asmcode::PUSH, asmcode::RAX); //possibly one call here? todo
          push(code, asmcode::RAX);
          }
        }
      else
        {
        const auto& reg = arg_reg[i];
        if (!data.ra->is_free_register(reg))
          {
          registers_that_were_not_free.push_back(reg);
          //code.add(asmcode::PUSH, reg);
          push(code, reg);
          }
        }
      }

    bool expressions_can_be_targetted = options.fast_expression_targetting;
    for (const auto& expr : prim.arguments)
      expressions_can_be_targetted &= expression_can_be_targetted(expr);
    expressions_can_be_targetted &= (prim.arguments.size() <= arg_reg.size());
    if (expressions_can_be_targetted && !prim.arguments.empty()) // check whether no overlap with variables
      {
      for (int i = 0; i < nr_prim_args; ++i)
        {
        const auto& arg = prim.arguments[i];
        if (std::holds_alternative<Variable>(arg))
          {
          const Variable& var = std::get<Variable>(arg);
          environment_entry e;
          if (env->find(e, var.name) && (e.st == environment_entry::st_register))
            {
            if (e.pos < (uint64_t)arg_reg[i])
              {
              expressions_can_be_targetted = false;
              }
            }
          }
        }
      }

    if (expressions_can_be_targetted)
      {
      // we choose this order of evaluation as it has most likelyhood to not interact with variables saved in register (I think)
      for (int i = 0; i < prim.arguments.size(); ++i)
        compile_expression(fns, env, rd, data, code, prim.arguments[i], pm, options, arg_reg[i], false);
      }
    else
      {
      if (nr_prim_args > 0)
        {
        for (int i = 0; i < nr_prim_args - 1; ++i)
          {
          compile_expression(fns, env, rd, data, code, prim.arguments[i], pm, options);
          //code.add(asmcode::PUSH, asmcode::RAX);
          push(code, asmcode::RAX);
          }
        compile_expression(fns, env, rd, data, code, prim.arguments.back(), pm, options);
        int i = (int)prim.arguments.size() - 1;
        if (i >= arg_reg.size())
          {
          uint32_t local_id = (uint32_t)(i - (int)arg_reg.size());
          if (local_id >= data.local_stack_size)
            throw_error(too_many_locals);
          save_to_local(code, local_id);
          }
        else
          {
          const auto& reg = arg_reg[i];
          code.add(asmcode::MOV, reg, asmcode::RAX);
          }
        }

      for (int i = nr_prim_args - 2; i >= 0; --i)
        {
        if (i >= arg_reg.size())
          {
          uint32_t local_id = (uint32_t)(i - (int)arg_reg.size());
          if (local_id >= data.local_stack_size)
            throw_error(too_many_locals);
          //code.add(asmcode::POP, asmcode::RAX);
          pop(code, asmcode::RAX);
          save_to_local(code, local_id);
          }
        else
          {
          const auto& reg = arg_reg[i];
          //code.add(asmcode::POP, reg);
          pop(code, reg);
          }
        }
      }

    // here call primitive

    std::string continue_label = label_to_string(label++);

    if (prim.primitive_name == "halt")
      {
      if (options.garbage_collection)
        {
        code.add(asmcode::COMMENT, "clean all locals for gc");
        //Here we clear all our registers, so that they can be cleaned up by the gc
        code.add(asmcode::MOV, asmcode::R15, LOCAL);
        code.add(asmcode::MOV, asmcode::R11, asmcode::R15);
        code.add(asmcode::ADD, asmcode::R11, asmcode::NUMBER, CELLS(data.local_stack_size));
        auto repeat_clean_locals = label_to_string(label++);
        code.add(asmcode::LABEL, repeat_clean_locals);
        code.add(asmcode::MOV, asmcode::MEM_R15, asmcode::NUMBER, unalloc_tag);
        code.add(asmcode::ADD, asmcode::R15, asmcode::NUMBER, 8);
        code.add(asmcode::CMP, asmcode::R15, asmcode::R11);
        code.add(asmcode::JLS, repeat_clean_locals);
        code.add(asmcode::COMMENT, "clean all registers for gc");
        code.add(asmcode::MOV, asmcode::RDX, asmcode::NUMBER, unalloc_tag);
        code.add(asmcode::MOV, asmcode::RSI, asmcode::NUMBER, unalloc_tag);
        code.add(asmcode::MOV, asmcode::RDI, asmcode::NUMBER, unalloc_tag);
        code.add(asmcode::MOV, asmcode::R8, asmcode::NUMBER, unalloc_tag);
        code.add(asmcode::MOV, asmcode::R9, asmcode::NUMBER, unalloc_tag);
        code.add(asmcode::MOV, asmcode::R12, asmcode::NUMBER, unalloc_tag);
        code.add(asmcode::MOV, asmcode::R14, asmcode::NUMBER, unalloc_tag);
        std::string garbage_error = label_to_string(label++);
        std::string continue_label2 = label_to_string(label++);
        code.add(asmcode::CMP, ALLOC, LIMIT);
        code.add(asmcode::JLES, continue_label2);
        code.add(asmcode::CMP, ALLOC, FROM_SPACE_END);
        code.add(asmcode::JGES, garbage_error);
        code.add(asmcode::COMMENT, "jump to reclaim-garbage");
        auto pm_it = pm.find("reclaim-garbage");
        if (pm_it == pm.end())
          throw_error(primitive_unknown, "reclaim-garbage");
        code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, pm_it->second.address);
        code.add(asmcode::MOV, CONTINUE, asmcode::LABELADDRESS, continue_label2);
        code.add(asmcode::JMP, asmcode::RAX);
        error_label(code, garbage_error, re_heap_full);
        code.add(asmcode::LABEL, continue_label2);

        }
      code.add(asmcode::MOV, CONTINUE, asmcode::LABELADDRESS, data.halt_label);
      }
    else
      code.add(asmcode::MOV, CONTINUE, asmcode::LABELADDRESS, continue_label);

    code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, prim.arguments.size());

    auto pm_it = pm.find(prim.primitive_name);
    if (pm_it == pm.end())
      throw_error(prim.line_nr, prim.column_nr, prim.filename, primitive_unknown, prim.primitive_name);
    code.add(asmcode::COMMENT, "jump to " + pm_it->first);
    code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, pm_it->second.address);
    code.add(asmcode::JMP, asmcode::RAX);

    code.add(asmcode::LABEL, continue_label);

    /*
    Restore the registers and locals that were not free in reverse order
    */
    for (auto it = locals_that_were_not_free.rbegin(); it != locals_that_were_not_free.rend(); ++it)
      {
      uint32_t local_id = *it;
      if (local_id >= data.local_stack_size)
        throw_error(too_many_locals);
      //code.add(asmcode::POP, asmcode::R11);
      pop(code, asmcode::R11);
      save_to_local(code, local_id, asmcode::R11, asmcode::R15);
      }
    for (auto it = registers_that_were_not_free.rbegin(); it != registers_that_were_not_free.rend(); ++it)
      {
      //code.add(asmcode::POP, *it);
      pop(code, *it);
      }
    }